

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O0

void project_monster_handler_MON_HEAL(project_monster_handler_context_t *context)

{
  project_monster_handler_context_t *context_local;
  
  context->mon->hp = context->mon->hp + (short)context->dam;
  if (context->mon->maxhp < context->mon->hp) {
    context->mon->hp = context->mon->maxhp;
  }
  if (player->upkeep->health_who == context->mon) {
    player->upkeep->redraw = player->upkeep->redraw | 0x200;
  }
  else {
    context->hurt_msg = MON_MSG_HEALTHIER;
  }
  context->dam = L'\0';
  return;
}

Assistant:

static void project_monster_handler_MON_HEAL(project_monster_handler_context_t *context)
{
	/* Heal */
	context->mon->hp += context->dam;

	/* No overflow */
	if (context->mon->hp > context->mon->maxhp)
		context->mon->hp = context->mon->maxhp;

	/* Redraw (later) if needed */
	if (player->upkeep->health_who == context->mon)
		player->upkeep->redraw |= (PR_HEALTH);

	/* Message */
	else context->hurt_msg = MON_MSG_HEALTHIER;

	/* No "real" damage */
	context->dam = 0;
}